

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_internal.h
# Opt level: O2

void __thiscall
ASDCP::MXF::TrackFileWriter<ASDCP::MXF::OP1aHeader>::AddEssenceDescriptor
          (TrackFileWriter<ASDCP::MXF::OP1aHeader> *this,UL *WrappingUL)

{
  OP1aHeader *HeaderPart;
  set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_> *this_00;
  FileDescriptor *pFVar1;
  Preface *pPVar2;
  SourcePackage *pSVar3;
  undefined8 uVar4;
  MDDEntry *pMVar5;
  _List_node_base *p_Var6;
  UL local_90;
  UL local_70;
  UL local_50;
  
  pFVar1 = this->m_EssenceDescriptor;
  (pFVar1->EssenceContainer).super_Identifier<16U>.m_HasValue =
       (WrappingUL->super_Identifier<16U>).m_HasValue;
  uVar4 = *(undefined8 *)((WrappingUL->super_Identifier<16U>).m_Value + 8);
  *(undefined8 *)(pFVar1->EssenceContainer).super_Identifier<16U>.m_Value =
       *(undefined8 *)(WrappingUL->super_Identifier<16U>).m_Value;
  *(undefined8 *)((pFVar1->EssenceContainer).super_Identifier<16U>.m_Value + 8) = uVar4;
  pPVar2 = (this->m_HeaderPart).m_Preface;
  pSVar3 = this->m_FilePackage;
  (pPVar2->PrimaryPackage).m_property.super_Identifier<16U>.m_HasValue =
       (pSVar3->super_GenericPackage).super_InterchangeObject.InstanceUID.super_Identifier<16U>.
       m_HasValue;
  uVar4 = *(undefined8 *)
           ((pSVar3->super_GenericPackage).super_InterchangeObject.InstanceUID.super_Identifier<16U>
            .m_Value + 8);
  *(undefined8 *)(pPVar2->PrimaryPackage).m_property.super_Identifier<16U>.m_Value =
       *(undefined8 *)
        (pSVar3->super_GenericPackage).super_InterchangeObject.InstanceUID.super_Identifier<16U>.
        m_Value;
  *(undefined8 *)((pPVar2->PrimaryPackage).m_property.super_Identifier<16U>.m_Value + 8) = uVar4;
  (pPVar2->PrimaryPackage).m_has_value = true;
  if (this->m_Dict != (Dictionary *)0x0) {
    HeaderPart = &this->m_HeaderPart;
    pMVar5 = Dictionary::Type(this->m_Dict,MDD_GCMulti);
    local_50.super_Identifier<16U>.m_HasValue = true;
    local_50.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar5->ul;
    local_50.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar5->ul + 8);
    local_50.super_Identifier<16U>.super_IArchive._vptr_IArchive =
         (_func_int **)&PTR__IArchive_002112c8;
    this_00 = &(this->m_HeaderPart).super_Partition.EssenceContainers.
               super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
               super_PushSet<ASDCP::UL>.
               super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>;
    std::
    _Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>
    ::_M_insert_unique<ASDCP::UL_const&>
              ((_Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>
                *)this_00,&local_50);
    if ((this->m_Info).EncryptedEssence == true) {
      pMVar5 = Dictionary::Type(this->m_Dict,MDD_EncryptedContainerLabel);
      local_70.super_Identifier<16U>.m_HasValue = true;
      local_70.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar5->ul;
      local_70.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar5->ul + 8);
      local_70.super_Identifier<16U>.super_IArchive._vptr_IArchive =
           (_func_int **)&PTR__IArchive_002112c8;
      std::
      _Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>
      ::_M_insert_unique<ASDCP::UL_const&>
                ((_Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>
                  *)this_00,&local_70);
      pPVar2 = (this->m_HeaderPart).m_Preface;
      pMVar5 = Dictionary::Type(this->m_Dict,MDD_CryptographicFrameworkLabel);
      local_90.super_Identifier<16U>.m_HasValue = true;
      local_90.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar5->ul;
      local_90.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar5->ul + 8);
      local_90.super_Identifier<16U>.super_IArchive._vptr_IArchive =
           (_func_int **)&PTR__IArchive_002112c8;
      std::
      _Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>
      ::_M_insert_unique<ASDCP::UL_const&>
                ((_Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>
                  *)&(pPVar2->DMSchemes).
                     super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
                     super_PushSet<ASDCP::UL>.
                     super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>,
                 &local_90);
      AddDmsCrypt(&HeaderPart->super_Partition,this->m_FilePackage,&this->m_Info,WrappingUL,
                  this->m_Dict);
    }
    else {
      std::
      _Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>
      ::_M_insert_unique<ASDCP::UL_const&>
                ((_Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>
                  *)this_00,WrappingUL);
    }
    std::
    _Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
    ::operator=(&(((this->m_HeaderPart).m_Preface)->EssenceContainers).
                 super_FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>.
                 super_PushSet<ASDCP::UL>.
                 super_set<ASDCP::UL,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>._M_t,
                &this_00->_M_t);
    Partition::AddChildObject
              (&HeaderPart->super_Partition,(InterchangeObject *)this->m_EssenceDescriptor);
    p_Var6 = (_List_node_base *)&this->m_EssenceSubDescriptorList;
    while (p_Var6 = (((_List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                       *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var6 != (_List_node_base *)&this->m_EssenceSubDescriptorList) {
      Partition::AddChildObject(&HeaderPart->super_Partition,(InterchangeObject *)p_Var6[1]._M_next)
      ;
    }
    pSVar3 = this->m_FilePackage;
    pFVar1 = this->m_EssenceDescriptor;
    (pSVar3->Descriptor).super_Identifier<16U>.m_HasValue =
         (pFVar1->super_GenericDescriptor).super_InterchangeObject.InstanceUID.super_Identifier<16U>
         .m_HasValue;
    uVar4 = *(undefined8 *)
             ((pFVar1->super_GenericDescriptor).super_InterchangeObject.InstanceUID.
              super_Identifier<16U>.m_Value + 8);
    *(undefined8 *)(pSVar3->Descriptor).super_Identifier<16U>.m_Value =
         *(undefined8 *)
          (pFVar1->super_GenericDescriptor).super_InterchangeObject.InstanceUID.
          super_Identifier<16U>.m_Value;
    *(undefined8 *)((pSVar3->Descriptor).super_Identifier<16U>.m_Value + 8) = uVar4;
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                ,0x340,
                "void ASDCP::MXF::TrackFileWriter<ASDCP::MXF::OP1aHeader>::AddEssenceDescriptor(const UL &) [HeaderType = ASDCP::MXF::OP1aHeader]"
               );
}

Assistant:

void AddEssenceDescriptor(const UL& WrappingUL)
	{
	  //
	  // Essence Descriptor
	  //
	  m_EssenceDescriptor->EssenceContainer = WrappingUL;
	  m_HeaderPart.m_Preface->PrimaryPackage = m_FilePackage->InstanceUID;

	  //
	  // Essence Descriptors
	  //
	  assert(m_Dict);
#ifndef ASDCP_GCMULTI_PATCH
	  UL GenericContainerUL(m_Dict->ul(MDD_GCMulti));
	  m_HeaderPart.EssenceContainers.push_back(GenericContainerUL);
#endif

	  if ( m_Info.EncryptedEssence )
	    {
	      UL CryptEssenceUL(m_Dict->ul(MDD_EncryptedContainerLabel));
	      m_HeaderPart.EssenceContainers.push_back(CryptEssenceUL);
	      m_HeaderPart.m_Preface->DMSchemes.push_back(UL(m_Dict->ul(MDD_CryptographicFrameworkLabel)));
	      AddDmsCrypt(m_HeaderPart, *m_FilePackage, m_Info, WrappingUL, m_Dict);
	      //// TODO: fix DMSegment Duration value
	    }
	  else
	    {
	      m_HeaderPart.EssenceContainers.push_back(WrappingUL);
	    }

	  m_HeaderPart.m_Preface->EssenceContainers = m_HeaderPart.EssenceContainers;
	  m_HeaderPart.AddChildObject(m_EssenceDescriptor);

	  std::list<InterchangeObject*>::iterator sdli = m_EssenceSubDescriptorList.begin();
	  for ( ; sdli != m_EssenceSubDescriptorList.end(); sdli++ )
	    m_HeaderPart.AddChildObject(*sdli);

	  m_FilePackage->Descriptor = m_EssenceDescriptor->InstanceUID;
	}